

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autowah.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fb101::AutowahState::update
          (AutowahState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  anon_class_24_2_544d122c func;
  ALCdevice *pAVar1;
  float *in_RCX;
  unsigned_long in_RDX;
  anon_struct_136_3_13600e2c *in_RSI;
  long in_RDI;
  long in_R8;
  undefined8 in_R9;
  float fVar2;
  float fVar3;
  double dVar4;
  RealMixParams *unaff_retaddr;
  anon_class_24_2_544d122c set_gains;
  float ReleaseTime;
  float frequency;
  ALCdevice *device;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  
  pAVar1 = al::intrusive_ptr<ALCdevice>::get
                     ((intrusive_ptr<ALCdevice> *)(in_RSI[3].TargetGains + 8));
  fVar2 = (float)pAVar1->Frequency;
  fVar3 = clampf((float)((ulong)in_stack_ffffffffffffff70 >> 0x20),(float)in_stack_ffffffffffffff70,
                 (float)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  dVar4 = std::exp((double)(ulong)(uint)(-1.0 / (*in_RCX * fVar2)));
  *(int *)(in_RDI + 0x20) = SUB84(dVar4,0);
  dVar4 = std::exp((double)(ulong)(uint)(-1.0 / (fVar3 * fVar2)));
  *(int *)(in_RDI + 0x24) = SUB84(dVar4,0);
  dVar4 = std::log10((double)(ulong)(uint)in_RCX[2]);
  dVar4 = std::sqrt((double)CONCAT44((int)((ulong)dVar4 >> 0x20),(SUB84(dVar4,0) * 10.0) / 3.0));
  *(int *)(in_RDI + 0x28) = SUB84(dVar4,0);
  dVar4 = std::log10((double)(ulong)(uint)(in_RCX[3] / 31621.0));
  *(float *)(in_RDI + 0x2c) = 1.0 - SUB84(dVar4,0);
  *(float *)(in_RDI + 0x30) = 20.0 / fVar2;
  *(float *)(in_RDI + 0x34) = 2480.0 / fVar2;
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_R8 + 0x80);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_R8 + 0x88);
  std::begin<(anonymous_namespace)::AutowahState::__0,16ul>
            ((anon_struct_136_3_13600e2c (*) [16])(in_RDI + 0x203c));
  al::span<std::array<float,_1024UL>,_18446744073709551615UL>::size
            ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)(in_RDX + 0x88));
  func.target.Main = (MixParams *)in_R9;
  func.slot = (EffectSlot *)in_R8;
  func.target.RealOut = unaff_retaddr;
  SetAmbiPanIdentity<(anonymous_namespace)::AutowahState::__0*,unsigned_long,(anonymous_namespace)::AutowahState::update(ALCcontext_const*,EffectSlot_const*,EffectProps_const*,EffectTarget)::__0>
            (in_RSI,in_RDX,func);
  return;
}

Assistant:

void AutowahState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};
    const auto frequency = static_cast<float>(device->Frequency);

    const float ReleaseTime{clampf(props->Autowah.ReleaseTime, 0.001f, 1.0f)};

    mAttackRate    = std::exp(-1.0f / (props->Autowah.AttackTime*frequency));
    mReleaseRate   = std::exp(-1.0f / (ReleaseTime*frequency));
    /* 0-20dB Resonance Peak gain */
    mResonanceGain = std::sqrt(std::log10(props->Autowah.Resonance)*10.0f / 3.0f);
    mPeakGain      = 1.0f - std::log10(props->Autowah.PeakGain/AL_AUTOWAH_MAX_PEAK_GAIN);
    mFreqMinNorm   = MIN_FREQ / frequency;
    mBandwidthNorm = (MAX_FREQ-MIN_FREQ) / frequency;

    mOutTarget = target.Main->Buffer;
    auto set_gains = [slot,target](auto &chan, al::span<const float,MAX_AMBI_CHANNELS> coeffs)
    { ComputePanGains(target.Main, coeffs.data(), slot->Gain, chan.TargetGains); };
    SetAmbiPanIdentity(std::begin(mChans), slot->Wet.Buffer.size(), set_gains);
}